

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

kvtree * kvtree_get_kv(kvtree *hash,char *key,char *val)

{
  kvtree *hash_00;
  kvtree *v;
  kvtree *k;
  char *val_local;
  char *key_local;
  kvtree *hash_local;
  
  if (hash == (kvtree *)0x0) {
    hash_local = (kvtree *)0x0;
  }
  else {
    hash_00 = kvtree_get(hash,key);
    if (hash_00 == (kvtree *)0x0) {
      hash_local = (kvtree *)0x0;
    }
    else {
      hash_local = kvtree_get(hash_00,val);
      if (hash_local == (kvtree *)0x0) {
        hash_local = (kvtree *)0x0;
      }
    }
  }
  return hash_local;
}

Assistant:

kvtree* kvtree_get_kv(const kvtree* hash, const char* key, const char* val)
{
  if (hash == NULL) {
    return NULL;
  }

  kvtree* k = kvtree_get(hash, key);
  if (k == NULL) {
    return NULL;
  }

  kvtree* v = kvtree_get(k, val);
  if (v == NULL) {
    return NULL;
  }

  return v;
}